

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O3

void mi_page_queue_enqueue_from_ex
               (mi_page_queue_t *to,mi_page_queue_t *from,_Bool enqueue_at_end,mi_page_t *page)

{
  long lVar1;
  mi_page_t *pmVar2;
  mi_page_s *pmVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  mi_page_queue_t *pmVar9;
  mi_page_t *pmVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar1 = *(long *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x40);
  pmVar2 = *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48);
  pmVar3 = *(mi_page_s **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50);
  if (pmVar3 != (mi_page_s *)0x0) {
    pmVar3->next = pmVar2;
  }
  if (pmVar2 != (mi_page_t *)0x0) {
    pmVar2->prev = pmVar3;
  }
  if (from->last == (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end)) {
    from->last = *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50);
  }
  if (from->first == (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end)) {
    from->first = pmVar2;
    auVar6 = _DAT_00a004e0;
    auVar5 = _DAT_00a004d0;
    uVar14 = from->block_size;
    if (uVar14 < 0x401) {
      pmVar10 = &_mi_page_empty;
      if (pmVar2 != (mi_page_t *)0x0) {
        pmVar10 = pmVar2;
      }
      if (*(mi_page_t **)(lVar1 + 0xf8 + (uVar14 + 7 & 0xfffffffffffffff8)) != pmVar10) {
        uVar12 = uVar14 + 7 >> 3;
        if (uVar14 < 9) {
          uVar14 = 0;
        }
        else {
          if (uVar14 < 0x41) {
            uVar14 = (ulong)((int)uVar12 + 1U & 0x1e);
          }
          else {
            uVar14 = uVar12 - 1;
            uVar15 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            uVar14 = ((ulong)((uint)(uVar14 >> (0x3dU - (char)(uVar15 ^ 0x3f) & 0x3f)) & 3) +
                      ((uVar15 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          pmVar9 = from + -1;
          do {
            uVar8 = pmVar9->block_size + 7;
            uVar15 = uVar8 >> 3;
            if (uVar8 < 0x48) {
              uVar16 = (ulong)((int)uVar15 + 1U & 0x1e);
              if (uVar8 < 0x10) {
                uVar16 = 1;
              }
            }
            else if (uVar8 < 0x10008) {
              uVar8 = uVar15 - 1;
              uVar16 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                }
              }
              uVar16 = ((ulong)((uint)(uVar8 >> (0x3dU - (char)(uVar16 ^ 0x3f) & 0x3f)) & 3) +
                        ((uVar16 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
            }
            else {
              uVar16 = 0x49;
            }
          } while ((uVar14 == uVar16) &&
                  (bVar4 = (mi_page_queue_t *)(lVar1 + 0x500U) < pmVar9, pmVar9 = pmVar9 + -1, bVar4
                  ));
          uVar14 = uVar15 + 1;
          if (uVar12 <= uVar15) {
            uVar14 = uVar12;
          }
          if (uVar12 < uVar14) goto LAB_00917d95;
        }
        lVar13 = uVar12 - uVar14;
        auVar17._8_4_ = (int)lVar13;
        auVar17._0_8_ = lVar13;
        auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
        lVar11 = lVar1 + uVar14 * 8;
        uVar14 = 0;
        auVar17 = auVar17 ^ _DAT_00a004e0;
        do {
          auVar19._8_4_ = (int)uVar14;
          auVar19._0_8_ = uVar14;
          auVar19._12_4_ = (int)(uVar14 >> 0x20);
          auVar19 = (auVar19 | auVar5) ^ auVar6;
          if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                      auVar17._4_4_ < auVar19._4_4_) & 1)) {
            *(mi_page_t **)(lVar11 + 0xf8 + uVar14 * 8) = pmVar10;
          }
          if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
              auVar19._12_4_ <= auVar17._12_4_) {
            *(mi_page_t **)(lVar11 + 0x100 + uVar14 * 8) = pmVar10;
          }
          uVar14 = uVar14 + 2;
        } while ((lVar13 + 2U & 0xfffffffffffffffe) != uVar14);
      }
    }
  }
LAB_00917d95:
  pmVar2 = to->last;
  *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50) = pmVar2;
  *(undefined8 *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48) = 0;
  if (pmVar2 == (mi_page_t *)0x0) {
    to->first = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
    to->last = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
    auVar6 = _DAT_00a004e0;
    auVar5 = _DAT_00a004d0;
    uVar14 = to->block_size;
    if ((uVar14 < 0x401) &&
       (*(long *)(lVar1 + 0xf8 + (uVar14 + 7 & 0xfffffffffffffff8)) !=
        CONCAT71(in_register_00000011,enqueue_at_end))) {
      uVar12 = uVar14 + 7 >> 3;
      if (uVar14 < 9) {
        uVar15 = 0;
      }
      else {
        if (uVar14 < 0x41) {
          uVar15 = (ulong)((int)uVar12 + 1U & 0x1e);
        }
        else {
          uVar15 = uVar12 - 1;
          uVar8 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar15 = ((ulong)((uint)(uVar15 >> (0x3dU - (char)(uVar8 ^ 0x3f) & 0x3f)) & 3) +
                    ((uVar8 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
        }
        pmVar9 = to + -1;
        do {
          uVar16 = pmVar9->block_size + 7;
          uVar8 = uVar16 >> 3;
          if (uVar16 < 0x48) {
            uVar7 = (ulong)((int)uVar8 + 1U & 0x1e);
            if (uVar16 < 0x10) {
              uVar7 = 1;
            }
          }
          else if (uVar16 < 0x10008) {
            uVar16 = uVar8 - 1;
            uVar7 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            uVar7 = ((ulong)((uint)(uVar16 >> (0x3dU - (char)(uVar7 ^ 0x3f) & 0x3f)) & 3) +
                     ((uVar7 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          else {
            uVar7 = 0x49;
          }
        } while ((uVar15 == uVar7) &&
                (bVar4 = (mi_page_queue_t *)(lVar1 + 0x500U) < pmVar9, pmVar9 = pmVar9 + -1, bVar4))
        ;
        uVar15 = uVar8 + 1;
        if (uVar12 <= uVar8) {
          uVar15 = uVar12;
        }
        if (uVar12 < uVar15) goto LAB_00917f3f;
      }
      lVar11 = uVar12 - uVar15;
      auVar18._8_4_ = (int)lVar11;
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar1 = lVar1 + uVar15 * 8;
      uVar12 = 0;
      auVar18 = auVar18 ^ _DAT_00a004e0;
      do {
        auVar20._8_4_ = (int)uVar12;
        auVar20._0_8_ = uVar12;
        auVar20._12_4_ = (int)(uVar12 >> 0x20);
        auVar17 = (auVar20 | auVar5) ^ auVar6;
        if ((bool)(~(auVar17._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar17._0_4_ ||
                    auVar18._4_4_ < auVar17._4_4_) & 1)) {
          *(ulong *)(lVar1 + 0xf8 + uVar12 * 8) = CONCAT71(in_register_00000011,enqueue_at_end);
        }
        if ((auVar17._12_4_ != auVar18._12_4_ || auVar17._8_4_ <= auVar18._8_4_) &&
            auVar17._12_4_ <= auVar18._12_4_) {
          *(ulong *)(lVar1 + 0x100 + uVar12 * 8) = CONCAT71(in_register_00000011,enqueue_at_end);
        }
        uVar12 = uVar12 + 2;
      } while ((lVar11 + 2U & 0xfffffffffffffffe) != uVar12);
    }
  }
  else {
    pmVar2->next = (mi_page_s *)CONCAT71(in_register_00000011,enqueue_at_end);
    to->last = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
    uVar14 = to->block_size;
  }
LAB_00917f3f:
  *(byte *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0xe) =
       *(byte *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0xe) & 0xfe | uVar14 == 0x10010;
  return;
}

Assistant:

static void mi_page_queue_enqueue_from_ex(mi_page_queue_t* to, mi_page_queue_t* from, bool enqueue_at_end, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(from, page));
  mi_assert_expensive(!mi_page_queue_contains(to, page));
  const size_t bsize = mi_page_block_size(page);
  MI_UNUSED(bsize);
  mi_assert_internal((bsize == to->block_size && bsize == from->block_size) ||
                     (bsize == to->block_size && mi_page_queue_is_full(from)) ||
                     (bsize == from->block_size && mi_page_queue_is_full(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_full(to)));

  mi_heap_t* heap = mi_page_heap(page);

  // delete from `from`
  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == from->last)  from->last = page->prev;
  if (page == from->first) {
    from->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, from));
    mi_heap_queue_first_update(heap, from);
  }

  // insert into `to`
  if (enqueue_at_end) {
    // enqueue at the end
    page->prev = to->last;
    page->next = NULL;
    if (to->last != NULL) {
      mi_assert_internal(heap == mi_page_heap(to->last));
      to->last->next = page;
      to->last = page;
    }
    else {
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }
  else {
    if (to->first != NULL) {
      // enqueue at 2nd place
      mi_assert_internal(heap == mi_page_heap(to->first));
      mi_page_t* next = to->first->next;
      page->prev = to->first;
      page->next = next;
      to->first->next = page;
      if (next != NULL) {
        next->prev = page;
      }
      else {
        to->last = page;
      }
    }
    else {
      // enqueue at the head (singleton list)
      page->prev = NULL;
      page->next = NULL;
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }

  mi_page_set_in_full(page, mi_page_queue_is_full(to));
}